

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O3

TriStateResult __thiscall QFSFileEngine::cloneTo(QFSFileEngine *this,QAbstractFileEngine *target)

{
  QAbstractFileEnginePrivate *pQVar1;
  FILE *__stream;
  TriStateResult TVar2;
  uint uVar3;
  int srcfd;
  int dstfd;
  
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  uVar3 = (*target->_vptr_QAbstractFileEngine[0x16])(target,0x200000);
  TVar2 = NotSupported;
  if ((uVar3 >> 0x15 & 1) != 0) {
    __stream = (FILE *)pQVar1[3].errorString.d.ptr;
    if (__stream == (FILE *)0x0) {
      srcfd = *(int *)&pQVar1[3].q_ptr;
    }
    else {
      srcfd = fileno(__stream);
    }
    dstfd = (*target->_vptr_QAbstractFileEngine[0x1f])(target);
    TVar2 = QFileSystemEngine::cloneFile(srcfd,dstfd,(QFileSystemMetaData *)&pQVar1[2].errorString);
    if (TVar2 == Failed) {
      cloneTo(this);
      TVar2 = Failed;
    }
  }
  return TVar2;
}

Assistant:

QAbstractFileEngine::TriStateResult QFSFileEngine::cloneTo(QAbstractFileEngine *target)
{
    Q_D(QFSFileEngine);
    if ((target->fileFlags(LocalDiskFlag) & LocalDiskFlag) == 0)
        return TriStateResult::NotSupported;

    int srcfd = d->nativeHandle();
    int dstfd = target->handle();
    TriStateResult r = QFileSystemEngine::cloneFile(srcfd, dstfd, d->metaData);
    if (r == TriStateResult::Failed)
        setError(QFile::CopyError, qt_error_string(errno));
    return r;
}